

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void spell_hailstorm(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  CHAR_DATA *pCVar1;
  bool bVar2;
  char *pcVar3;
  CHAR_DATA *in_RDX;
  int dam;
  CHAR_DATA *vch_next;
  CHAR_DATA *vch;
  char buf [4608];
  undefined4 in_stack_ffffffffffffed98;
  int in_stack_ffffffffffffed9c;
  int in_stack_ffffffffffffeda0;
  undefined4 in_stack_ffffffffffffeda4;
  undefined4 in_stack_ffffffffffffeda8;
  undefined4 in_stack_ffffffffffffedac;
  char *in_stack_ffffffffffffedb0;
  CHAR_DATA *ach;
  CHAR_DATA *in_stack_ffffffffffffedd8;
  int in_stack_ffffffffffffede0;
  
  dice(in_stack_ffffffffffffeda0,in_stack_ffffffffffffed9c);
  is_outside((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedac,in_stack_ffffffffffffeda8));
  act(in_stack_ffffffffffffedb0,
      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedac,in_stack_ffffffffffffeda8),
      (void *)CONCAT44(in_stack_ffffffffffffeda4,in_stack_ffffffffffffeda0),
      (void *)CONCAT44(in_stack_ffffffffffffed9c,in_stack_ffffffffffffed98),0);
  act(in_stack_ffffffffffffedb0,
      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedac,in_stack_ffffffffffffeda8),
      (void *)CONCAT44(in_stack_ffffffffffffeda4,in_stack_ffffffffffffeda0),
      (void *)CONCAT44(in_stack_ffffffffffffed9c,in_stack_ffffffffffffed98),0);
  pCVar1 = in_RDX->in_room->people;
  while (ach = pCVar1, ach != (CHAR_DATA *)0x0) {
    pCVar1 = ach->next_in_room;
    bVar2 = is_same_group(ach,in_RDX);
    if (((!bVar2) &&
        (bVar2 = is_safe((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffeda4,in_stack_ffffffffffffeda0),
                         (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed9c,in_stack_ffffffffffffed98))
        , !bVar2)) && (bVar2 = is_same_cabal(in_RDX,ach), !bVar2)) {
      bVar2 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed9c,in_stack_ffffffffffffed98));
      if (((!bVar2) &&
          (bVar2 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed9c,in_stack_ffffffffffffed98)
                         ), !bVar2)) &&
         ((in_RDX->fighting == (CHAR_DATA *)0x0 || (ach->fighting == (CHAR_DATA *)0x0)))) {
        pcVar3 = pers((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedac,in_stack_ffffffffffffeda8),
                      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffeda4,in_stack_ffffffffffffeda0));
        snprintf(&stack0xffffffffffffedd8,0x1200,"Die, %s you sorcerous dog!",pcVar3);
        do_myell((CHAR_DATA *)in_stack_ffffffffffffedb0,
                 (char *)CONCAT44(in_stack_ffffffffffffedac,in_stack_ffffffffffffeda8),
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffeda4,in_stack_ffffffffffffeda0));
      }
      saves_spell(in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8,(int)((ulong)ach >> 0x20));
      in_stack_ffffffffffffed98 = 0;
      in_stack_ffffffffffffeda0 = 0;
      in_stack_ffffffffffffeda8 = 1;
      in_stack_ffffffffffffedb0 = "hailstorm";
      damage_new((CHAR_DATA *)buf._232_8_,(CHAR_DATA *)buf._224_8_,buf._220_4_,buf._216_4_,
                 buf._212_4_,(bool)buf[0xd3],(bool)buf[0xd2],buf._264_4_,buf._272_4_,
                 (char *)buf._280_8_);
    }
  }
  return;
}

Assistant:

void spell_hailstorm(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	char buf[MSL];
	CHAR_DATA *vch, *vch_next;
	int dam;

	dam = dice(level, 4);

	if (is_outside(ch))
		dam = (int)((float)dam * 1.75);

	act("You conjure a rain of deadly hailstones to pelt the area!", ch, 0, 0, TO_CHAR);
	act("$n throws $s arms in the air, calling a rain of deadly hailstones upon the area!", ch, 0, 0, TO_ROOM);

	for (vch = ch->in_room->people; vch; vch = vch_next)
	{
		vch_next = vch->next_in_room;

		if (is_same_group(vch, ch) || is_safe(ch, vch) || is_same_cabal(ch, vch))
			continue;

		if (!is_npc(ch) && !is_npc(vch) && (!ch->fighting || !vch->fighting))
		{
			std::snprintf(buf, static_cast<size_t>(MSL), "Die, %s you sorcerous dog!", pers(ch, vch));
			do_myell(vch, buf, ch);
		}

		if (saves_spell(level, vch, DAM_COLD))
			dam /= 2;

		damage_new(ch, vch, dam, TYPE_UNDEFINED, DAM_COLD, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "hailstorm");
	}
}